

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O2

errr text_lines_to_file(char *path,text_writer writer)

{
  _Bool _Var1;
  errr eVar2;
  ang_file *f;
  char *fname;
  char new_fname [1024];
  char old_fname [1024];
  
  fname = new_fname;
  file_get_tempfile(new_fname,0x400,path,"new");
  file_get_tempfile(old_fname,0x400,path,"old");
  f = file_open(new_fname,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    eVar2 = -1;
  }
  else {
    text_out_file = f;
    (*writer)(f);
    text_out_file = (ang_file *)0x0;
    file_close(f);
    _Var1 = file_exists(path);
    if (_Var1) {
      _Var1 = file_move(path,old_fname);
      if (_Var1) {
        file_move(new_fname,path);
        fname = old_fname;
      }
      file_delete(fname);
    }
    else {
      file_move(new_fname,path);
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

errr text_lines_to_file(const char *path, text_writer writer)
{
	char new_fname[1024];
	char old_fname[1024];

	ang_file *new_file;

	/* Format filenames */
	file_get_tempfile(new_fname, sizeof(new_fname), path, "new");
	file_get_tempfile(old_fname, sizeof(old_fname), path, "old");

	/* Write new file */
	new_file = file_open(new_fname, MODE_WRITE, FTYPE_TEXT);
	if (!new_file) {
		return -1;
	}

	text_out_file = new_file;
	writer(new_file);
	text_out_file = NULL;

	file_close(new_file);

	/* Move files around */
	if (!file_exists(path)) {
		file_move(new_fname, path);
	} else if (file_move(path, old_fname)) {
		file_move(new_fname, path);
		file_delete(old_fname);
	} else {
		file_delete(new_fname);
	}

	return 0;
}